

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

ssize_t __thiscall mario::Buffer::readFd(Buffer *this,int fd,int *savedErrno)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  iovec vec [2];
  char extrabuf [65536];
  
  vec[0].iov_base =
       (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start + this->_writerIndex;
  uVar3 = (long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)vec[0].iov_base;
  vec[1].iov_base = extrabuf;
  vec[1].iov_len = 0x10000;
  vec[0].iov_len = uVar3;
  uVar1 = readv(fd,(iovec *)vec,2);
  if ((long)uVar1 < 0) {
    piVar2 = __errno_location();
    *savedErrno = *piVar2;
  }
  else if (uVar1 < uVar3 || uVar1 - uVar3 == 0) {
    this->_writerIndex = this->_writerIndex + uVar1;
  }
  else {
    this->_writerIndex =
         (long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    append(this,extrabuf,uVar1 - uVar3);
  }
  return uVar1;
}

Assistant:

ssize_t Buffer::readFd(int fd, int* savedErrno) {
    char extrabuf[65536];
    struct iovec vec[2];
    const size_t writable = writableBytes();
    vec[0].iov_base = begin() + _writerIndex;
    vec[0].iov_len = writable;
    vec[1].iov_base = extrabuf;
    vec[1].iov_len = sizeof(extrabuf);
    const ssize_t n = readv(fd, vec, 2);
    if (n < 0) {
        *savedErrno = errno;
    } else if (n <= writable) {
        _writerIndex += n;
    } else {
        _writerIndex = _buffer.size();
        append(extrabuf, n - writable);
    }
    return n;
}